

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcList.c
# Opt level: O0

void Mvc_CoverAddCubeHead_(Mvc_Cover_t *pCover,Mvc_Cube_t *pCube)

{
  Mvc_List_t *pMVar1;
  Mvc_List_t *pList;
  Mvc_Cube_t *pCube_local;
  Mvc_Cover_t *pCover_local;
  
  pMVar1 = &pCover->lCubes;
  if (pMVar1->pHead == (Mvc_Cube_t *)0x0) {
    pCube->pNext = (Mvc_Cube_t *)0x0;
    pMVar1->pHead = pCube;
    (pCover->lCubes).pTail = pCube;
  }
  else {
    pCube->pNext = pMVar1->pHead;
    pMVar1->pHead = pCube;
  }
  (pCover->lCubes).nItems = (pCover->lCubes).nItems + 1;
  return;
}

Assistant:

void Mvc_CoverAddCubeHead_( Mvc_Cover_t * pCover, Mvc_Cube_t * pCube )
{
    Mvc_List_t * pList = &pCover->lCubes;
    if ( pList->pHead == NULL )
    {
        Mvc_CubeSetNext( pCube, NULL );
        pList->pHead = pCube;
        pList->pTail = pCube;
    }
    else
    {
        Mvc_CubeSetNext( pCube, pList->pHead );
        pList->pHead = pCube;
    }
    pList->nItems++;
}